

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O1

PatternList *
parse_argv(PatternList *__return_storage_ptr__,Tokens *tokens,
          vector<docopt::Option,_std::allocator<docopt::Option>_> *options,bool options_first)

{
  int iVar1;
  string *psVar2;
  undefined7 in_register_00000009;
  _Alloc_hider _Var3;
  long lVar4;
  bool bVar5;
  undefined1 local_71;
  shared_ptr<docopt::Argument> local_70;
  string local_60;
  undefined4 local_3c;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000009,options_first);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (tokens->fIndex <
      (ulong)((long)(tokens->fTokens).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(tokens->fTokens).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    local_38 = options;
    do {
      psVar2 = Tokens::current_abi_cxx11_(tokens);
      iVar1 = std::__cxx11::string::compare((char *)psVar2);
      if (iVar1 == 0) {
        while (tokens->fIndex <
               (ulong)((long)(tokens->fTokens).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(tokens->fTokens).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          Tokens::pop_abi_cxx11_(&local_60,tokens);
          local_70.super___shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<docopt::Argument,std::allocator<docopt::Argument>,char_const(&)[1],std::__cxx11::string>
                    (&local_70.super___shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Argument **)&local_70,(allocator<docopt::Argument> *)&local_71,
                     (char (*) [1])0x199619,&local_60);
          std::
          vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
          ::emplace_back<std::shared_ptr<docopt::Argument>>
                    ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                      *)__return_storage_ptr__,&local_70);
          if (local_70.super___shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.super___shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
        }
      }
      else {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"--","");
        if (psVar2->_M_string_length < local_60._M_string_length) {
          bVar5 = false;
        }
        else if (local_60._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          iVar1 = bcmp(local_60._M_dataplus._M_p,(psVar2->_M_dataplus)._M_p,
                       local_60._M_string_length);
          bVar5 = iVar1 == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        if (bVar5) {
          parse_long((PatternList *)&local_60,tokens,local_38);
          lVar4 = (long)(local_60._M_string_length - (long)local_60._M_dataplus._M_p) >> 4;
          if (0 < lVar4) {
            lVar4 = lVar4 + 1;
            _Var3._M_p = local_60._M_dataplus._M_p;
            do {
              std::
              vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              ::emplace_back<std::shared_ptr<docopt::Pattern>>
                        ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                          *)__return_storage_ptr__,(shared_ptr<docopt::Pattern> *)_Var3._M_p);
              _Var3._M_p = _Var3._M_p + 0x10;
              lVar4 = lVar4 + -1;
            } while (1 < lVar4);
          }
        }
        else {
          if ((*(psVar2->_M_dataplus)._M_p != '-') ||
             (iVar1 = std::__cxx11::string::compare((char *)psVar2), iVar1 == 0)) {
            if ((char)local_3c == '\0') {
              Tokens::pop_abi_cxx11_(&local_60,tokens);
              local_70.super___shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<docopt::Argument,std::allocator<docopt::Argument>,char_const(&)[1],std::__cxx11::string>
                        (&local_70.super___shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(Argument **)&local_70,
                         (allocator<docopt::Argument> *)&local_71,(char (*) [1])0x199619,&local_60);
              std::
              vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              ::emplace_back<std::shared_ptr<docopt::Argument>>
                        ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                          *)__return_storage_ptr__,&local_70);
              if (local_70.super___shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_70.super___shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p);
              }
            }
            else {
              while (tokens->fIndex <
                     (ulong)((long)(tokens->fTokens).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(tokens->fTokens).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                Tokens::pop_abi_cxx11_(&local_60,tokens);
                local_70.super___shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<docopt::Argument,std::allocator<docopt::Argument>,char_const(&)[1],std::__cxx11::string>
                          (&local_70.
                            super___shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Argument **)&local_70,
                           (allocator<docopt::Argument> *)&local_71,(char (*) [1])0x199619,&local_60
                          );
                std::
                vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                ::emplace_back<std::shared_ptr<docopt::Argument>>
                          ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                            *)__return_storage_ptr__,&local_70);
                if (local_70.super___shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_70.
                             super___shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_60._M_dataplus._M_p != &local_60.field_2) {
                  operator_delete(local_60._M_dataplus._M_p);
                }
              }
            }
            goto LAB_00182b41;
          }
          parse_short((PatternList *)&local_60,tokens,local_38);
          lVar4 = (long)(local_60._M_string_length - (long)local_60._M_dataplus._M_p) >> 4;
          if (0 < lVar4) {
            lVar4 = lVar4 + 1;
            _Var3._M_p = local_60._M_dataplus._M_p;
            do {
              std::
              vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              ::emplace_back<std::shared_ptr<docopt::Pattern>>
                        ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                          *)__return_storage_ptr__,(shared_ptr<docopt::Pattern> *)_Var3._M_p);
              _Var3._M_p = _Var3._M_p + 0x10;
              lVar4 = lVar4 + -1;
            } while (1 < lVar4);
          }
        }
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   *)&local_60);
      }
LAB_00182b41:
    } while (tokens->fIndex <
             (ulong)((long)(tokens->fTokens).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(tokens->fTokens).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

PatternList parse_argv(Tokens tokens, std::vector<Option>& options, bool options_first)
{
	// Parse command-line argument vector.
	//
	// If options_first:
	//    argv ::= [ long | shorts ]* [ argument ]* [ '--' [ argument ]* ] ;
	// else:
	//    argv ::= [ long | shorts | argument ]* [ '--' [ argument ]* ] ;
	
	PatternList ret;
	while (tokens) {
		auto const& token = tokens.current();
		
		if (token=="--") {
			// option list is done; convert all the rest to arguments
			while (tokens) {
				ret.emplace_back(std::make_shared<Argument>("", tokens.pop()));
			}
		} else if (starts_with(token, "--")) {
			auto&& parsed = parse_long(tokens, options);
			std::move(parsed.begin(), parsed.end(), std::back_inserter(ret));
		} else if (token[0]=='-' && token != "-") {
			auto&& parsed = parse_short(tokens, options);
			std::move(parsed.begin(), parsed.end(), std::back_inserter(ret));
		} else if (options_first) {
			// option list is done; convert all the rest to arguments
			while (tokens) {
				ret.emplace_back(std::make_shared<Argument>("", tokens.pop()));
			}
		} else {
			ret.emplace_back(std::make_shared<Argument>("", tokens.pop()));
		}
	}
	
	return ret;
}